

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::map_sequence
          (LongReadsMapper *this,NKmerIndex *nkindex,char *query_sequence_ptr,sgNodeID_t seq_id)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *candidate_counts_00;
  NKmerIndex *pNVar2;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_RDI;
  reference rVar3;
  uint64_t i;
  vector<bool,_std::allocator<bool>_> kmer_in_assembly;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  StreamKmerFactory skf;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> private_results;
  undefined7 in_stack_fffffffffffffc58;
  uint8_t in_stack_fffffffffffffc5f;
  NKmerIndex *in_stack_fffffffffffffc60;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *this_00;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  allocator_type *in_stack_fffffffffffffc70;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *this_01;
  char *in_stack_fffffffffffffc78;
  StreamKmerFactory *in_stack_fffffffffffffc80;
  vector<bool,_std::allocator<bool>_> *this_02;
  uint32_t in_stack_fffffffffffffc9c;
  LongReadsMapper *this_03;
  _Bit_type *in_stack_fffffffffffffce8;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffffcf0;
  NKmerIndex *matches;
  NKmerIndex *assembly_kmers;
  LongReadsMapper *in_stack_fffffffffffffd00;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> local_2b0;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  local_298 [14];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffec4;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffed4;
  LongReadsMapper *in_stack_fffffffffffffed8;
  
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3f5a3c);
  StreamKmerFactory::StreamKmerFactory
            ((StreamKmerFactory *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5f);
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *
         )0x3f5a69);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)0x3f5a76);
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  clear((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_> *)
        0x3f5a80);
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)
             ((in_RSI->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p + 8));
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3f5aae);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc80,
             (size_type)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3f5ad4);
  StreamKmerFactory::produce_all_kmers
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
              *)in_stack_fffffffffffffc70);
  candidate_counts_00 =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
       std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
       ::size(local_298);
  this_03 = (LongReadsMapper *)&stack0xfffffffffffffd07;
  std::allocator<bool>::allocator((allocator<bool> *)0x3f5b17);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc70,
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             (allocator_type *)in_stack_fffffffffffffc60);
  std::allocator<bool>::~allocator((allocator<bool> *)0x3f5b3d);
  rVar3._M_mask = (_Bit_type)in_stack_fffffffffffffc80;
  rVar3._M_p = in_stack_fffffffffffffce8;
  matches = (NKmerIndex *)0x0;
  while( true ) {
    assembly_kmers = matches;
    pNVar2 = (NKmerIndex *)
             std::
             vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
             ::size(local_298);
    this_02 = (vector<bool,_std::allocator<bool>_> *)rVar3._M_mask;
    if (pNVar2 <= matches) break;
    std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
    operator[](local_298,(size_type)assembly_kmers);
    bVar1 = NKmerIndex::filter(in_stack_fffffffffffffc60,
                               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    in_stack_fffffffffffffc9c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc9c);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (this_02,(size_type)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffcf0 =
         (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *)rVar3._M_mask;
    std::_Bit_reference::operator=
              ((_Bit_reference *)&stack0xfffffffffffffce8,
               (bool)((byte)(in_stack_fffffffffffffc9c >> 0x18) & 1));
    matches = (NKmerIndex *)((long)&(assembly_kmers->bfilter).estimated_size + 1);
  }
  get_all_kmer_matches
            (in_stack_fffffffffffffd00,assembly_kmers,in_stack_fffffffffffffcf0,
             (vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
              *)rVar3._M_p,in_RSI);
  this_00 = local_298;
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  size(this_00);
  this_01 = &local_2b0;
  count_candidates(this_03,candidate_counts_00,
                   (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    *)matches,in_stack_fffffffffffffc9c);
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  size(this_00);
  alignment_blocks(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x3f5d6a)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             *)this_01);
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  ~vector((vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
           *)this_01);
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::~vector(this_01);
  return in_RDI;
}

Assistant:

std::vector<LongReadMapping> LongReadsMapper::map_sequence(const NKmerIndex &nkindex, const char * query_sequence_ptr, sgNodeID_t seq_id) {
    std::vector<LongReadMapping> private_results;

    StreamKmerFactory skf(k);
    std::vector<std::pair<bool, uint64_t>> read_kmers;
    std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
    read_kmers.clear();

    std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);
    skf.produce_all_kmers(query_sequence_ptr, read_kmers);

    std::vector<bool> kmer_in_assembly(read_kmers.size());

    for (uint64_t i = 0; i < read_kmers.size(); ++i) {
        kmer_in_assembly[i] = nkindex.filter(read_kmers[i].second);
    }
    get_all_kmer_matches(nkindex, node_matches, read_kmers, kmer_in_assembly);

    //========== 2. Find match candidates in fixed windows ==========

    count_candidates(candidate_counts, node_matches,read_kmers.size());

    //========== 3. Create alignment blocks from candidates ==========

    return alignment_blocks(seq_id,node_matches,read_kmers.size(), candidate_counts);

}